

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

int match_shaders(void *_a,void *_b,void *data)

{
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  GLuint bf;
  GLuint af;
  GLuint bv;
  GLuint av;
  BoundShaders *b;
  BoundShaders *a;
  void *data_local;
  void *_b_local;
  void *_a_local;
  
  if (*_a == 0) {
    local_4c = 0;
  }
  else {
    local_4c = *(int *)(*_a + 8);
  }
  if (*_b == 0) {
    local_50 = 0;
  }
  else {
    local_50 = *(int *)(*_b + 8);
  }
  if (local_4c == local_50) {
    if (*(long *)((long)_a + 8) == 0) {
      local_54 = 0;
    }
    else {
      local_54 = *(int *)(*(long *)((long)_a + 8) + 8);
    }
    if (*(long *)((long)_b + 8) == 0) {
      local_58 = 0;
    }
    else {
      local_58 = *(int *)(*(long *)((long)_b + 8) + 8);
    }
    if (local_54 == local_58) {
      _a_local._4_4_ = 1;
    }
    else {
      _a_local._4_4_ = 0;
    }
  }
  else {
    _a_local._4_4_ = 0;
  }
  return _a_local._4_4_;
}

Assistant:

static int match_shaders(const void *_a, const void *_b, void *data)
{
    (void) data;
    const BoundShaders *a = (const BoundShaders *) _a;
    const BoundShaders *b = (const BoundShaders *) _b;

    const GLuint av = (a->vertex) ? a->vertex->handle : 0;
    const GLuint bv = (b->vertex) ? b->vertex->handle : 0;
    if (av != bv)
        return 0;

    const GLuint af = (a->fragment) ? a->fragment->handle : 0;
    const GLuint bf = (b->fragment) ? b->fragment->handle : 0;
    if (af != bf)
        return 0;

    return 1;
}